

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  MessageLite *pMVar1;
  int iVar2;
  Extension *pEVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 != (Extension *)0x0) {
    if ((pEVar3->field_0xa & 2) == 0) {
      if (pEVar3->is_repeated == false) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 10) {
          pMVar1 = (MessageLite *)(pEVar3->field_0).int64_t_value;
          if ((pEVar3->field_0xa & 4) == 0) {
            return pMVar1;
          }
          iVar2 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
          iVar2 = (*pMVar1->_vptr_MessageLite[3])
                            (pMVar1,CONCAT44(extraout_var_00,iVar2),this->arena_,
                             pMVar1->_vptr_MessageLite[3]);
          return (MessageLite *)CONCAT44(extraout_var_01,iVar2);
        }
      }
      else {
        GetMessage();
      }
      GetMessage();
    }
  }
  iVar2 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
  return (MessageLite *)CONCAT44(extraout_var,iVar2);
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type), arena_);
    } else {
      return *extension->ptr.message_value;
    }
  }
}